

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O3

_Bool xdr_opaque_auth_encode(XDR *xdrs,opaque_auth *oa)

{
  uint uVar1;
  _Bool _Var2;
  uint in_EAX;
  uint *puVar3;
  uint *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uStack_28;
  
  uVar1 = oa->oa_flavor;
  puVar4 = (uint *)(xdrs->x_v).vio_wrap;
  puVar3 = (uint *)((long)xdrs->x_data + 4);
  uStack_28._0_4_ = in_EAX;
  if (puVar4 < puVar3) {
    _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var2) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar7 = "%s:%u ERROR oa_flavor";
      pcVar6 = "xdr_opaque_auth_encode";
      uVar5 = 0x55;
      goto LAB_00123e97;
    }
    puVar3 = (uint *)xdrs->x_data;
    puVar4 = (uint *)(xdrs->x_v).vio_wrap;
  }
  else {
    *(uint *)xdrs->x_data =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)puVar3;
  }
  uVar1 = oa->oa_length;
  if (puVar4 < puVar3 + 1) {
    _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var2) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar7 = "%s:%u ERROR oa_length";
      pcVar6 = "xdr_opaque_auth_encode";
      uVar5 = 0x5b;
      goto LAB_00123e97;
    }
  }
  else {
    *puVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)(puVar3 + 1);
  }
  uVar1 = oa->oa_length;
  if (uVar1 == 0) {
    return true;
  }
  if (uVar1 < 0x191) {
    _Var2 = (*xdrs->x_ops->x_putbytes)(xdrs,oa->oa_body,uVar1);
    if (_Var2) {
      if ((uVar1 & 3) == 0) {
        return true;
      }
      uStack_28 = (ulong)(uint)uStack_28;
      _Var2 = (*xdrs->x_ops->x_putbytes)(xdrs,(char *)((long)&uStack_28 + 4),4 - (uVar1 & 3));
      if (_Var2) {
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR zero","xdr_opaque_encode",0x1f8);
      }
    }
    else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar7 = "%s:%u ERROR opaque";
      pcVar6 = "xdr_opaque_encode";
      uVar5 = 0x1e8;
LAB_00123e97:
      (*__ntirpc_pkg_params.warnx_)(pcVar7,pcVar6,uVar5);
      return false;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_encode_it",0x3f,(ulong)uVar1,400);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_opaque_auth_encode(XDR *xdrs, struct opaque_auth *oa)
{
	/*
	 * XDR_INLINE is just as likely to do a function call,
	 * so don't bother with it here.
	 */
	if (!xdr_putenum(xdrs, oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	}
	if (!xdr_putuint32(xdrs, oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return (xdr_opaque_auth_encode_it(xdrs, oa));
	}
	return (true);	/* 0 length succeeds */
}